

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mainEth1394.cpp
# Opt level: O2

void PrintIOExp(uint32_t iodata)

{
  ostream *poVar1;
  
  *(uint *)(std::__cxx11::string::find + *(long *)(std::cout + -0x18)) =
       *(uint *)(std::__cxx11::string::find + *(long *)(std::cout + -0x18)) & 0xffffffb5 | 8;
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
  std::operator<<(poVar1,"  :");
  if ((iodata >> 0x18 & 1) != 0) {
    poVar1 = std::operator<<((ostream *)&std::cout," output_error (");
    poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
    std::operator<<(poVar1,") ");
  }
  if ((iodata >> 0x19 & 1) != 0) {
    std::operator<<((ostream *)&std::cout," read_error");
  }
  if ((iodata >> 0x1a & 1) != 0) {
    std::operator<<((ostream *)&std::cout," do_reg_io");
  }
  if ((iodata >> 0x1b & 1) != 0) {
    std::operator<<((ostream *)&std::cout," reg_io_read");
  }
  if ((iodata >> 0x1c & 1) != 0) {
    std::operator<<((ostream *)&std::cout," other_busy");
  }
  *(uint *)(std::__cxx11::string::find + *(long *)(std::cout + -0x18)) =
       *(uint *)(std::__cxx11::string::find + *(long *)(std::cout + -0x18)) & 0xffffffb5 | 2;
  std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
  return;
}

Assistant:

void PrintIOExp(uint32_t iodata)
{
    std::cout << std::hex << (iodata&0x0000ffff) << "  :";
    bool output_error = iodata&0x01000000;
    if (output_error)
        std::cout << " output_error (" << ((iodata&0x00ff0000)>>16) << ") ";
    if (iodata&0x02000000) std::cout << " read_error";
    if (iodata&0x04000000) std::cout << " do_reg_io";
    if (iodata&0x08000000) std::cout << " reg_io_read";
    if (iodata&0x10000000) std::cout << " other_busy";
    std::cout << std::dec << std::endl;
}